

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O2

size_t __thiscall OPNMIDIplay::chooseDevice(OPNMIDIplay *this,string *name)

{
  iterator iVar1;
  size_t sVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  pStack_1d8;
  value_type local_1b0;
  string local_188 [32];
  MIDIchannel local_168;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->m_midiDevices)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_midiDevices)._M_t._M_impl.super__Rb_tree_header)
  {
    sVar2 = (this->m_midiDevices)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::__cxx11::string::string(local_188,(string *)name);
    std::__cxx11::string::string((string *)&pStack_1d8,local_188);
    sVar2 = sVar2 * 0x10;
    pStack_1d8.second = sVar2;
    std::pair<std::__cxx11::string_const,unsigned_long>::pair<std::__cxx11::string,unsigned_long>
              ((pair<std::__cxx11::string_const,unsigned_long> *)&local_1b0,&pStack_1d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::_M_insert_unique(&(this->m_midiDevices)._M_t,&local_1b0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    MIDIchannel::MIDIchannel(&local_168);
    std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::resize
              (&this->m_midiChannels,sVar2 + 0x10,&local_168);
    pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::~pl_list(&local_168.activenotes);
    resetMIDIDefaults(this,(int)sVar2);
  }
  else {
    sVar2 = *(size_t *)(iVar1._M_node + 2);
  }
  return sVar2;
}

Assistant:

size_t OPNMIDIplay::chooseDevice(const std::string &name)
{
    std::map<std::string, size_t>::iterator i = m_midiDevices.find(name);

    if(i != m_midiDevices.end())
        return i->second;

    size_t n = m_midiDevices.size() * 16;
    m_midiDevices.insert(std::make_pair(name, n));
    m_midiChannels.resize(n + 16);
    resetMIDIDefaults(static_cast<int>(n));
    return n;
}